

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall CLI::Option::single_name_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  bool bVar1;
  const_reference pvVar2;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Option *local_18;
  Option *this_local;
  
  local_18 = this;
  this_local = (Option *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->lnames_);
  if (bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->snames_);
    if (bVar1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->pname_);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_70,"-",&local_71);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->snames_,0);
      ::std::operator+(__return_storage_ptr__,&local_70,pvVar2);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"--",&local_39);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->lnames_,0);
    ::std::operator+(__return_storage_ptr__,&local_38,pvVar2);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string single_name() const {
        if(!lnames_.empty())
            return std::string("--") + lnames_[0];
        else if(!snames_.empty())
            return std::string("-") + snames_[0];
        else
            return pname_;
    }